

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

void __thiscall ymfm::ym2608::write_address(ym2608 *this,uint8_t data)

{
  uint8_t prescale;
  undefined7 in_register_00000031;
  
  this->m_address = (uint16_t)CONCAT71(in_register_00000031,data);
  if (2 < (byte)(data - 0x2d)) {
    return;
  }
  if (data == '-') {
    prescale = '\x06';
  }
  else if (data == '/') {
    prescale = '\x02';
  }
  else {
    prescale = '\x03';
    if ((this->m_fm).m_clock_prescale != '\x06') {
      return;
    }
  }
  update_prescale(this,prescale);
  return;
}

Assistant:

void ym2608::write_address(uint8_t data)
{
	// just set the address
	m_address = data;

	// special case: update the prescale
	if (m_address >= 0x2d && m_address <= 0x2f)
	{
		// 2D-2F: prescaler select
		if (m_address == 0x2d)
			update_prescale(6);
		else if (m_address == 0x2e && m_fm.clock_prescale() == 6)
			update_prescale(3);
		else if (m_address == 0x2f)
			update_prescale(2);
	}
}